

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void transpose_64bit_4x4_avx2(__m256i *src,__m256i *dst)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i reg3;
  __m256i reg2;
  __m256i reg1;
  __m256i reg0;
  
  auVar3 = vpunpcklqdq_avx2(*in_RDI,in_RDI[1]);
  auVar4 = vpunpcklqdq_avx2(in_RDI[2],in_RDI[3]);
  auVar1 = vpunpckhqdq_avx2(*in_RDI,in_RDI[1]);
  auVar2 = vpunpckhqdq_avx2(in_RDI[2],in_RDI[3]);
  auVar5._0_16_ = ZEXT116(0) * auVar4._0_16_ + ZEXT116(1) * auVar3._0_16_;
  auVar5._16_16_ = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * auVar4._0_16_;
  *in_RSI = auVar5;
  auVar6._0_16_ = ZEXT116(0) * auVar2._0_16_ + ZEXT116(1) * auVar1._0_16_;
  auVar6._16_16_ = ZEXT116(0) * auVar1._16_16_ + ZEXT116(1) * auVar2._0_16_;
  in_RSI[1] = auVar6;
  auVar3 = vblendps_avx(auVar4,ZEXT1632(auVar3._16_16_),0xf);
  in_RSI[2] = auVar3;
  auVar3 = vblendps_avx(auVar2,ZEXT1632(auVar1._16_16_),0xf);
  in_RSI[3] = auVar3;
  return;
}

Assistant:

static inline void transpose_64bit_4x4_avx2(const __m256i *const src,
                                            __m256i *const dst) {
  // Unpack 64 bit elements. Goes from:
  // src[0]: 00 01 02 03
  // src[1]: 10 11 12 13
  // src[2]: 20 21 22 23
  // src[3]: 30 31 32 33
  // to:
  // reg0:    00 10 02 12
  // reg1:    20 30 22 32
  // reg2:    01 11 03 13
  // reg3:    21 31 23 33
  const __m256i reg0 = _mm256_unpacklo_epi64(src[0], src[1]);
  const __m256i reg1 = _mm256_unpacklo_epi64(src[2], src[3]);
  const __m256i reg2 = _mm256_unpackhi_epi64(src[0], src[1]);
  const __m256i reg3 = _mm256_unpackhi_epi64(src[2], src[3]);

  // Unpack 64 bit elements resulting in:
  // dst[0]: 00 10 20 30
  // dst[1]: 01 11 21 31
  // dst[2]: 02 12 22 32
  // dst[3]: 03 13 23 33
  dst[0] = _mm256_inserti128_si256(reg0, _mm256_castsi256_si128(reg1), 1);
  dst[1] = _mm256_inserti128_si256(reg2, _mm256_castsi256_si128(reg3), 1);
  dst[2] = _mm256_inserti128_si256(reg1, _mm256_extracti128_si256(reg0, 1), 0);
  dst[3] = _mm256_inserti128_si256(reg3, _mm256_extracti128_si256(reg2, 1), 0);
}